

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointAddDestinationFilter(HelicsEndpoint end,char *filterName,HelicsError *err)

{
  string_view filterName_00;
  EndpointObject *pEVar1;
  EndpointObject *endObj;
  HelicsError *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  Endpoint *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pEVar1 != (EndpointObject *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
    filterName_00._M_str = (char *)pEVar1;
    filterName_00._M_len = in_stack_ffffffffffffffd8;
    helics::Endpoint::addDestinationFilter(in_stack_ffffffffffffffd0,filterName_00);
  }
  return;
}

Assistant:

void helicsEndpointAddDestinationFilter(HelicsEndpoint end, const char* filterName, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addDestinationFilter(filterName);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}